

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

void __thiscall Minisat::Solver::removeSatisfied(Solver *this,vec<unsigned_int,_int> *cs)

{
  uint uVar1;
  Clause *this_00;
  bool bVar2;
  Size SVar3;
  int iVar4;
  int iVar5;
  uint *puVar6;
  Lit *pLVar7;
  Lit *pLVar8;
  bool local_69;
  lbool local_41;
  int local_40;
  uint8_t local_39;
  int k;
  lbool local_32;
  uint8_t local_31;
  int local_30;
  lbool local_29;
  Clause *local_28;
  Clause *c;
  int j;
  int i;
  vec<unsigned_int,_int> *cs_local;
  Solver *this_local;
  
  c._0_4_ = 0;
  c._4_4_ = 0;
  _j = cs;
  cs_local = (vec<unsigned_int,_int> *)this;
  do {
    iVar5 = c._4_4_;
    SVar3 = vec<unsigned_int,_int>::size(_j);
    if (SVar3 <= iVar5) {
      vec<unsigned_int,_int>::shrink(_j,c._4_4_ - (int)c);
      return;
    }
    puVar6 = vec<unsigned_int,_int>::operator[](_j,c._4_4_);
    local_28 = ClauseAllocator::operator[](&this->ca,*puVar6);
    bVar2 = satisfied(this,local_28);
    if (bVar2) {
      puVar6 = vec<unsigned_int,_int>::operator[](_j,c._4_4_);
      removeClause(this,*puVar6);
    }
    else {
      pLVar7 = Clause::operator[](local_28,0);
      local_30 = pLVar7->x;
      local_29 = value(this,(Lit)local_30);
      local_31 = l_Undef.value;
      bVar2 = lbool::operator==(&local_29,l_Undef);
      local_69 = false;
      if (bVar2) {
        pLVar7 = Clause::operator[](local_28,1);
        k = pLVar7->x;
        local_32 = value(this,(Lit)k);
        local_39 = l_Undef.value;
        local_69 = lbool::operator==(&local_32,l_Undef);
      }
      if (local_69 == false) {
        __assert_fail("value(c[0]) == l_Undef && value(c[1]) == l_Undef",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/core/Solver.cc"
                      ,0x262,"void Minisat::Solver::removeSatisfied(vec<CRef> &)");
      }
      for (local_40 = 2; iVar5 = local_40, iVar4 = Clause::size(local_28), iVar5 < iVar4;
          local_40 = local_40 + 1) {
        pLVar7 = Clause::operator[](local_28,local_40);
        local_41 = value(this,(Lit)pLVar7->x);
        bVar2 = lbool::operator==(&local_41,l_False);
        this_00 = local_28;
        if (bVar2) {
          iVar5 = Clause::size(local_28);
          pLVar7 = Clause::operator[](this_00,iVar5 + -1);
          iVar5 = local_40;
          local_40 = local_40 + -1;
          pLVar8 = Clause::operator[](local_28,iVar5);
          pLVar8->x = pLVar7->x;
          Clause::pop(local_28);
        }
      }
      puVar6 = vec<unsigned_int,_int>::operator[](_j,c._4_4_);
      iVar5 = (int)c;
      uVar1 = *puVar6;
      c._0_4_ = (int)c + 1;
      puVar6 = vec<unsigned_int,_int>::operator[](_j,iVar5);
      *puVar6 = uVar1;
    }
    c._4_4_ = c._4_4_ + 1;
  } while( true );
}

Assistant:

void Solver::removeSatisfied(vec<CRef>& cs)
{
    int i, j;
    for (i = j = 0; i < cs.size(); i++){
        Clause& c = ca[cs[i]];
        if (satisfied(c))
            removeClause(cs[i]);
        else{
            // Trim clause:
            assert(value(c[0]) == l_Undef && value(c[1]) == l_Undef);
            for (int k = 2; k < c.size(); k++)
                if (value(c[k]) == l_False){
                    c[k--] = c[c.size()-1];
                    c.pop();
                }
            cs[j++] = cs[i];
        }
    }
    cs.shrink(i - j);
}